

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

QSize __thiscall QAbstractItemView::sizeHintForIndex(QAbstractItemView *this,QModelIndex *index)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  QStyleOptionViewItem QStack_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xffffffff00000000;
  uVar2 = 0xffffffff;
  if (((-1 < index->r) && (-1 < index->c)) &&
     ((index->m).ptr == *(QAbstractItemModel **)(*(long *)(this + 8) + 0x2f8))) {
    plVar1 = (long *)(**(code **)(*(long *)this + 0x208))(this,index);
    memset(&QStack_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&QStack_108);
    (**(code **)(*(long *)this + 0x2f8))(this,&QStack_108);
    if (plVar1 != (long *)0x0) {
      uVar2 = (**(code **)(*plVar1 + 0x68))(plVar1,&QStack_108,index);
      uVar3 = uVar2 & 0xffffffff00000000;
      uVar2 = uVar2 & 0xffffffff;
    }
    QBrush::~QBrush(&QStack_108.backgroundBrush);
    if (&(QStack_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((QStack_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(QStack_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&QStack_108.icon);
    QLocale::~QLocale(&QStack_108.locale);
    QFont::~QFont(&QStack_108.font);
    QStyleOption::~QStyleOption(&QStack_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)(uVar2 | uVar3);
  }
  __stack_chk_fail();
}

Assistant:

QSize QAbstractItemView::sizeHintForIndex(const QModelIndex &index) const
{
    Q_D(const QAbstractItemView);
    if (!d->isIndexValid(index))
        return QSize();
    const auto delegate = itemDelegateForIndex(index);
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    return delegate ? delegate->sizeHint(option, index) : QSize();
}